

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

RTPTime __thiscall jrtplib::RTPSession::GetRTCPDelay(RTPSession *this)

{
  RTPSession *this_local;
  RTPTime t;
  
  if ((this->created & 1U) == 0) {
    RTPTime::RTPTime((RTPTime *)&this_local,0,0);
  }
  else if ((this->usingpollthread & 1U) == 0) {
    this_local = (RTPSession *)RTCPScheduler::GetTransmissionDelay(&this->rtcpsched);
  }
  else {
    RTPTime::RTPTime((RTPTime *)&this_local,0,0);
  }
  return (RTPTime)(double)this_local;
}

Assistant:

RTPTime RTPSession::GetRTCPDelay()
{
	if (!created)
		return RTPTime(0,0);
	if (usingpollthread)
		return RTPTime(0,0);

	SOURCES_LOCK
	SCHED_LOCK
	RTPTime t = rtcpsched.GetTransmissionDelay();
	SCHED_UNLOCK
	SOURCES_UNLOCK
	return t;
}